

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDfs.c
# Opt level: O3

int Gia_ManConeSize_rec(Gia_Man_t *p,Gia_Obj_t *pObj)

{
  uint uVar1;
  Gia_Obj_t *pGVar2;
  int iVar3;
  int iVar4;
  
  pGVar2 = p->pObjs;
  if (pGVar2 <= pObj) {
    iVar4 = 0;
    do {
      if (pGVar2 + p->nObjs <= pObj) break;
      iVar3 = (int)((long)pObj - (long)pGVar2 >> 2) * -0x55555555;
      if (p->nTravIdsAlloc <= iVar3) {
        __assert_fail("Gia_ObjId(p, pObj) < p->nTravIdsAlloc",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x264,"int Gia_ObjIsTravIdCurrent(Gia_Man_t *, Gia_Obj_t *)");
      }
      if (p->pTravIds[iVar3] == p->nTravIds) {
        return iVar4;
      }
      p->pTravIds[iVar3] = p->nTravIds;
      uVar1 = (uint)*(undefined8 *)pObj;
      if ((~uVar1 & 0x9fffffff) == 0) {
        return iVar4;
      }
      if (((int)uVar1 < 0) || ((uVar1 & 0x1fffffff) == 0x1fffffff)) {
        __assert_fail("Gia_ObjIsAnd(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaDfs.c"
                      ,0x167,"int Gia_ManConeSize_rec(Gia_Man_t *, Gia_Obj_t *)");
      }
      iVar3 = Gia_ManConeSize_rec(p,pObj + -(ulong)(uVar1 & 0x1fffffff));
      pObj = pObj + -(ulong)(*(uint *)&pObj->field_0x4 & 0x1fffffff);
      iVar4 = iVar4 + iVar3 + 1;
      pGVar2 = p->pObjs;
    } while (pGVar2 <= pObj);
  }
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

int Gia_ManConeSize_rec( Gia_Man_t * p, Gia_Obj_t * pObj )
{
    if ( Gia_ObjIsTravIdCurrent(p, pObj) )
        return 0;
    Gia_ObjSetTravIdCurrent(p, pObj);
    if ( Gia_ObjIsCi(pObj) )
        return 0;
    assert( Gia_ObjIsAnd(pObj) );
    return 1 + Gia_ManConeSize_rec( p, Gia_ObjFanin0(pObj) ) +
        Gia_ManConeSize_rec( p, Gia_ObjFanin1(pObj) );
}